

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenSwitchSetDefaultName(BinaryenExpressionRef expr,char *name)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id == SwitchId) {
    this = (IString *)strlen(name);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)name;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 3) = sVar1;
    return;
  }
  __assert_fail("expression->is<Switch>()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x8aa,"void BinaryenSwitchSetDefaultName(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenSwitchSetDefaultName(BinaryenExpressionRef expr,
                                  const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  // may be null or empty
  static_cast<Switch*>(expression)->default_ = name;
}